

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O2

void __thiscall test_event_listener::on_event(test_event_listener *this,raft_event event)

{
  int iVar1;
  ostream *poVar2;
  
  if (event - become_leader < 3) {
    iVar1 = *(int *)(&DAT_0014aa00 + (ulong)(event - become_leader) * 4);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->srv_id_);
    poVar2 = std::operator<<(poVar2,&DAT_0014aa00 + iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

virtual void on_event(raft_event event) override
    {
        switch (event)
        {
            case raft_event::become_follower:
                std::cout << srv_id_ << " becomes a follower" << std::endl;
                break;
            case raft_event::become_leader:
                std::cout << srv_id_ << " becomes a leader" << std::endl;
                break;
            case raft_event::logs_catch_up:
                std::cout << srv_id_ << " catch up all logs" << std::endl;
                break;
        }
    }